

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O0

uchar * __thiscall
QFSFileEnginePrivate::map(QFSFileEnginePrivate *this,qint64 offset,qint64 size,MemoryMapFlags flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int __fd;
  long lVar4;
  QAbstractFileEngine *this_00;
  void *pvVar5;
  StartAndLength *pSVar6;
  int *piVar7;
  long in_RDX;
  ulong in_RSI;
  QFSFileEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  void *mapAddress;
  off64_t realOffset;
  size_t realSize;
  int extra;
  int pageSize;
  int sharemode;
  int access;
  QFSFileEngine *q;
  qint64 maxFileOffset;
  uchar *address;
  undefined8 in_stack_fffffffffffffe58;
  MemoryMapFlag other;
  QFSFileEnginePrivate *in_stack_fffffffffffffe60;
  uchar **in_stack_fffffffffffffe68;
  FileError FVar8;
  QAbstractFileEngine *in_stack_fffffffffffffe70;
  QFSFileEnginePrivate *in_stack_fffffffffffffe80;
  size_t __len;
  undefined8 in_stack_fffffffffffffe98;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> flags_00;
  int local_128;
  uint local_124;
  uchar *local_f8;
  undefined4 uStack_a4;
  QFlagsStorageHelper<QFileDevice::MemoryMapFlag,_4> local_74;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_70;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_6c;
  Int local_10;
  long local_8;
  
  flags_00.i = (Int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  other = (MemoryMapFlag)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = std::numeric_limits<long>::max();
  this_00 = &q_func(in_RDI)->super_QAbstractFileEngine;
  local_10 = (in_RDI->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
             super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
  bVar1 = ::operator==((QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)
                       SUB84((ulong)in_stack_fffffffffffffe68 >> 0x20,0),
                       (OpenModeFlag)in_stack_fffffffffffffe60);
  iVar2 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  if (bVar1) {
    qt_error_string(iVar2);
    QAbstractFileEngine::setError
              (in_stack_fffffffffffffe70,(FileError)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               (QString *)in_stack_fffffffffffffe60);
    QString::~QString((QString *)0x172b00);
    local_f8 = (uchar *)0x0;
  }
  else if ((((long)in_RSI < 0) || (lVar4 < (long)in_RSI)) || (in_RDX < 1)) {
    qt_error_string(iVar2);
    QAbstractFileEngine::setError
              (in_stack_fffffffffffffe70,(FileError)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               (QString *)in_stack_fffffffffffffe60);
    QString::~QString((QString *)0x172b87);
    local_f8 = (uchar *)0x0;
  }
  else {
    QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)in_stack_fffffffffffffe60,other);
    bVar1 = doStat(in_stack_fffffffffffffe80,(MetaDataFlags)flags_00.i);
    if (bVar1) {
      QFileSystemMetaData::size(&in_RDI->metaData);
    }
    local_6c.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
         (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
         QFlags<QIODeviceBase::OpenModeFlag>::operator&
                   ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffe60,other);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_6c);
    local_124 = (uint)bVar1;
    local_70.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
         (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
         QFlags<QIODeviceBase::OpenModeFlag>::operator&
                   ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffe60,other);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_70);
    if (bVar1) {
      local_124 = local_124 | 2;
    }
    local_128 = 1;
    local_74.super_QFlagsStorage<QFileDevice::MemoryMapFlag>.i =
         (QFlagsStorage<QFileDevice::MemoryMapFlag>)
         QFlags<QFileDevice::MemoryMapFlag>::operator&
                   ((QFlags<QFileDevice::MemoryMapFlag> *)in_stack_fffffffffffffe60,other);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_74);
    if (bVar1) {
      local_128 = 2;
      local_124 = local_124 | 2;
    }
    iVar2 = getpagesize();
    iVar3 = (int)((long)in_RSI % (long)iVar2);
    __len = in_RDX + iVar3;
    __fd = nativeHandle(in_stack_fffffffffffffe60);
    pvVar5 = mmap64((void *)0x0,__len,local_124,local_128,__fd,
                    ((long)(iVar2 + -1) ^ 0xffffffffffffffffU) & in_RSI);
    if (pvVar5 == (void *)0xffffffffffffffff) {
      piVar7 = __errno_location();
      FVar8 = (FileError)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      switch(*piVar7) {
      case 9:
        qt_error_string(FVar8);
        QAbstractFileEngine::setError(this_00,FVar8,(QString *)in_stack_fffffffffffffe60);
        QString::~QString((QString *)0x172f02);
        break;
      case 0xc:
      case 0x17:
        __errno_location();
        FVar8 = (FileError)((ulong)this_00 >> 0x20);
        qt_error_string(FVar8);
        QAbstractFileEngine::setError
                  (in_stack_fffffffffffffe70,FVar8,(QString *)in_stack_fffffffffffffe60);
        QString::~QString((QString *)0x172f4c);
        break;
      case 0x16:
      default:
        __errno_location();
        qt_error_string(FVar8);
        QAbstractFileEngine::setError(in_stack_fffffffffffffe70,FVar8,(QString *)this_00);
        QString::~QString((QString *)0x172f95);
      }
      local_f8 = (uchar *)0x0;
    }
    else {
      local_f8 = (uchar *)((long)pvVar5 + (long)iVar3);
      pSVar6 = QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::operator[]
                         ((QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength> *)
                          in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      *(ulong *)pSVar6 = CONCAT44(uStack_a4,iVar3);
      pSVar6->length = in_RDX + iVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_f8;
}

Assistant:

uchar *QFSFileEnginePrivate::map(qint64 offset, qint64 size, QFile::MemoryMapFlags flags)
{
    qint64 maxFileOffset = std::numeric_limits<QT_OFF_T>::max();
#if (defined(Q_OS_LINUX) || defined(Q_OS_ANDROID)) && Q_PROCESSOR_WORDSIZE == 4
    // The Linux mmap2 system call on 32-bit takes a page-shifted 32-bit
    // integer so the maximum offset is 1 << (32+12) (the shift is always 12,
    // regardless of the actual page size). Unfortunately, the mmap64()
    // function is known to be broken in all Linux libcs (glibc, uclibc, musl
    // and Bionic): all of them do the right shift, but don't confirm that the
    // result fits into the 32-bit parameter to the kernel.

    maxFileOffset = qMin((Q_INT64_C(1) << (32+12)) - 1, maxFileOffset);
#endif

    Q_Q(QFSFileEngine);
    if (openMode == QIODevice::NotOpen) {
        q->setError(QFile::PermissionsError, qt_error_string(EACCES));
        return nullptr;
    }

    if (offset < 0 || offset > maxFileOffset
        || size <= 0
        || quint64(size) > quint64(size_t(-1))) {
        q->setError(QFile::UnspecifiedError, qt_error_string(EINVAL));
        return nullptr;
    }
    // If we know the mapping will extend beyond EOF, fail early to avoid
    // undefined behavior. Otherwise, let mmap have its say.
    if (doStat(QFileSystemMetaData::SizeAttribute)
            && (QT_OFF_T(size) > metaData.size() - QT_OFF_T(offset)))
        qWarning("QFSFileEngine::map: Mapping a file beyond its size is not portable");

    int access = 0;
    if (openMode & QIODevice::ReadOnly) access |= PROT_READ;
    if (openMode & QIODevice::WriteOnly) access |= PROT_WRITE;

    int sharemode = MAP_SHARED;
    if (flags & QFileDevice::MapPrivateOption) {
        sharemode = MAP_PRIVATE;
        access |= PROT_WRITE;
    }

#if defined(Q_OS_INTEGRITY)
    int pageSize = sysconf(_SC_PAGESIZE);
#else
    int pageSize = getpagesize();
#endif
    int extra = offset % pageSize;

    if (quint64(size + extra) > quint64((size_t)-1)) {
        q->setError(QFile::UnspecifiedError, qt_error_string(EINVAL));
        return nullptr;
    }

    size_t realSize = (size_t)size + extra;
    QT_OFF_T realOffset = QT_OFF_T(offset);
    realOffset &= ~(QT_OFF_T(pageSize - 1));

    void *mapAddress = QT_MMAP((void*)nullptr, realSize,
                   access, sharemode, nativeHandle(), realOffset);
    if (MAP_FAILED != mapAddress) {
        uchar *address = extra + static_cast<uchar*>(mapAddress);
        maps[address] = {extra, realSize};
        return address;
    }

    switch(errno) {
    case EBADF:
        q->setError(QFile::PermissionsError, qt_error_string(EACCES));
        break;
    case ENFILE:
    case ENOMEM:
        q->setError(QFile::ResourceError, qt_error_string(errno));
        break;
    case EINVAL:
        // size are out of bounds
    default:
        q->setError(QFile::UnspecifiedError, qt_error_string(errno));
        break;
    }
    return nullptr;
}